

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall ghc::filesystem::directory_iterator::impl::increment(impl *this,error_code *ec)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  int *piVar3;
  dirent *pdVar4;
  error_category *peVar5;
  
  __dirp = (DIR *)this->_dir;
  if (__dirp != (DIR *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    pdVar4 = readdir(__dirp);
    this->_entry = (dirent *)pdVar4;
    if (pdVar4 != (dirent *)0x0) {
      do {
        std::__cxx11::string::_M_assign((string *)&this->_dir_entry);
        path::append_name(&(this->_dir_entry)._path,this->_entry->d_name);
        copyToDirEntry(this);
        if (((ec->_M_value == 0xd) || (ec->_M_value == 1)) &&
           ((this->_options & skip_permission_denied) != none)) {
          peVar5 = (error_category *)std::_V2::system_category();
          ec->_M_value = 0;
          ec->_M_cat = peVar5;
        }
        else {
          pdVar2 = this->_entry;
          if (pdVar2->d_name[0] != '.') {
            return;
          }
          if (pdVar2->d_name[1] != '\0') {
            if (pdVar2->d_name[1] != '.') {
              return;
            }
            if (pdVar2->d_name[2] != '\0') {
              return;
            }
          }
        }
        *piVar3 = 0;
        pdVar4 = readdir((DIR *)this->_dir);
        this->_entry = (dirent *)pdVar4;
      } while (pdVar4 != (dirent *)0x0);
    }
    closedir((DIR *)this->_dir);
    this->_dir = (DIR *)0x0;
    (this->_dir_entry)._path._path._M_string_length = 0;
    *(this->_dir_entry)._path._path._M_dataplus._M_p = '\0';
    iVar1 = *piVar3;
    if (iVar1 != 0) {
      peVar5 = (error_category *)std::_V2::system_category();
      ec->_M_value = iVar1;
      ec->_M_cat = peVar5;
    }
  }
  return;
}

Assistant:

void increment(std::error_code& ec)
    {
        if (_dir) {
            bool skip;
            do {
                skip = false;
                errno = 0;
                _entry = ::readdir(_dir);
                if (_entry) {
                    _dir_entry._path = _base;
                    _dir_entry._path.append_name(_entry->d_name);
                    copyToDirEntry();
                    if (ec && (ec.value() == EACCES || ec.value() == EPERM) && (_options & directory_options::skip_permission_denied) == directory_options::skip_permission_denied) {
                        ec.clear();
                        skip = true;
                    }
                }
                else {
                    ::closedir(_dir);
                    _dir = nullptr;
                    _dir_entry._path.clear();
                    if (errno) {
                        ec = detail::make_system_error();
                    }
                    break;
                }
            } while (skip || std::strcmp(_entry->d_name, ".") == 0 || std::strcmp(_entry->d_name, "..") == 0);
        }
    }